

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QSize __thiscall
QIconLoaderEngine::actualSize(QIconLoaderEngine *this,QSize *size,Mode mode,State state)

{
  Type TVar1;
  uint uVar2;
  uint uVar3;
  QIconLoaderEngineEntry *pQVar4;
  uint uVar5;
  QSize QVar6;
  QSize QVar7;
  long in_FS_OFFSET;
  QIcon local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = entryForSize(&this->m_info,size,1);
  if (pQVar4 == (QIconLoaderEngineEntry *)0x0) {
    QVar6.wd.m_i = 0;
    QVar6.ht.m_i = 0;
    QVar7.wd.m_i = 0;
    QVar7.ht.m_i = 0;
  }
  else {
    TVar1 = (pQVar4->dir).type;
    if (TVar1 == Fallback) {
      QIcon::QIcon(&local_30,&pQVar4->filename);
      QVar6 = QIcon::actualSize(&local_30,size,mode,state);
      QVar7 = (QSize)((ulong)QVar6 >> 0x20);
      QIcon::~QIcon(&local_30);
    }
    else if (TVar1 == Scalable) {
      QVar6 = *size;
      QVar7 = (QSize)((ulong)QVar6 >> 0x20);
    }
    else {
      uVar3 = (int)(pQVar4->dir).scale * (int)(pQVar4->dir).size;
      uVar2 = (size->wd).m_i;
      uVar5 = (size->ht).m_i;
      if ((int)uVar2 < (int)uVar5) {
        uVar5 = uVar2;
      }
      if ((int)uVar3 < (int)uVar5) {
        uVar5 = uVar3;
      }
      QVar6.ht.m_i = 0;
      QVar6.wd.m_i = uVar5;
      QVar7 = QVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSize)((ulong)QVar6 & 0xffffffff | (long)QVar7 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QIconLoaderEngine::actualSize(const QSize &size, QIcon::Mode mode,
                                   QIcon::State state)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    QIconLoaderEngineEntry *entry = entryForSize(m_info, size);
    if (entry) {
        const QIconDirInfo &dir = entry->dir;
        if (dir.type == QIconDirInfo::Scalable) {
            return size;
        } else if (dir.type == QIconDirInfo::Fallback) {
            return QIcon(entry->filename).actualSize(size, mode, state);
        } else {
            int result = qMin<int>(dir.size * dir.scale, qMin(size.width(), size.height()));
            return QSize(result, result);
        }
    }
    return QSize(0, 0);
}